

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmListFileContext *lfc,cmExecutionStatus *status)

{
  pointer *ppCVar1;
  iterator __position;
  CallStackEntry entry;
  CallStackEntry local_10;
  
  this->Makefile = mf;
  __position._M_current =
       (mf->CallStack).
       super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (mf->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.Context = lfc;
    local_10.Status = status;
    std::vector<cmMakefile::CallStackEntry,std::allocator<cmMakefile::CallStackEntry>>::
    _M_realloc_insert<cmMakefile::CallStackEntry_const&>
              ((vector<cmMakefile::CallStackEntry,std::allocator<cmMakefile::CallStackEntry>> *)
               &mf->CallStack,__position,&local_10);
  }
  else {
    (__position._M_current)->Context = lfc;
    (__position._M_current)->Status = status;
    ppCVar1 = &(mf->CallStack).
               super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

cmMakefileCall::cmMakefileCall(cmMakefile* mf, const cmListFileContext& lfc,
                               cmExecutionStatus& status): Makefile(mf)
{
  cmMakefile::CallStackEntry entry = {&lfc, &status};
  this->Makefile->CallStack.push_back(entry);
}